

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob_detection.cpp
# Opt level: O0

BlobInfo * __thiscall
Blob_Detection::BlobDetection::getBestBlob(BlobDetection *this,BlobCriterion criterion)

{
  const_iterator cVar1;
  const_iterator cVar2;
  undefined8 uVar3;
  undefined4 in_ESI;
  vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
  *in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff28;
  imageException *in_stack_ffffffffffffff30;
  __normal_iterator<const_Blob_Detection::BlobInfo_*,_std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>_>
  local_c0 [2];
  BlobInfo *local_b0;
  BlobInfo *local_a8;
  __normal_iterator<const_Blob_Detection::BlobInfo_*,_std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>_>
  local_a0 [2];
  BlobInfo *local_90;
  BlobInfo *local_88;
  __normal_iterator<const_Blob_Detection::BlobInfo_*,_std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>_>
  local_80 [2];
  BlobInfo *local_70;
  BlobInfo *local_68;
  __normal_iterator<const_Blob_Detection::BlobInfo_*,_std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>_>
  local_60 [2];
  BlobInfo *local_50;
  BlobInfo *local_48;
  __normal_iterator<const_Blob_Detection::BlobInfo_*,_std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>_>
  local_40 [2];
  BlobInfo *local_30;
  BlobInfo *local_28;
  __normal_iterator<const_Blob_Detection::BlobInfo_*,_std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>_>
  local_20 [3];
  reference local_8;
  
  switch(in_ESI) {
  case 0:
    local_28 = (BlobInfo *)
               std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::
               begin(in_stack_fffffffffffffef8);
    local_30 = (BlobInfo *)
               std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::end
                         (in_stack_fffffffffffffef8);
    local_20[0] = std::
                  max_element<__gnu_cxx::__normal_iterator<Blob_Detection::BlobInfo_const*,std::vector<Blob_Detection::BlobInfo,std::allocator<Blob_Detection::BlobInfo>>>,Blob_Detection::BlobDetection::getBestBlob(Blob_Detection::BlobDetection::BlobCriterion)const::__0>
                            (local_28,local_30);
    local_8 = __gnu_cxx::
              __normal_iterator<const_Blob_Detection::BlobInfo_*,_std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>_>
              ::operator*(local_20);
    break;
  case 1:
    local_48 = (BlobInfo *)
               std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::
               begin(in_stack_fffffffffffffef8);
    local_50 = (BlobInfo *)
               std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::end
                         (in_stack_fffffffffffffef8);
    local_40[0] = std::
                  max_element<__gnu_cxx::__normal_iterator<Blob_Detection::BlobInfo_const*,std::vector<Blob_Detection::BlobInfo,std::allocator<Blob_Detection::BlobInfo>>>,Blob_Detection::BlobDetection::getBestBlob(Blob_Detection::BlobDetection::BlobCriterion)const::__1>
                            (local_48,local_50);
    local_8 = __gnu_cxx::
              __normal_iterator<const_Blob_Detection::BlobInfo_*,_std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>_>
              ::operator*(local_40);
    break;
  case 2:
    local_68 = (BlobInfo *)
               std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::
               begin(in_stack_fffffffffffffef8);
    local_70 = (BlobInfo *)
               std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::end
                         (in_stack_fffffffffffffef8);
    local_60[0] = std::
                  max_element<__gnu_cxx::__normal_iterator<Blob_Detection::BlobInfo_const*,std::vector<Blob_Detection::BlobInfo,std::allocator<Blob_Detection::BlobInfo>>>,Blob_Detection::BlobDetection::getBestBlob(Blob_Detection::BlobDetection::BlobCriterion)const::__2>
                            (local_68,local_70);
    local_8 = __gnu_cxx::
              __normal_iterator<const_Blob_Detection::BlobInfo_*,_std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>_>
              ::operator*(local_60);
    break;
  case 3:
    local_88 = (BlobInfo *)
               std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::
               begin(in_stack_fffffffffffffef8);
    local_90 = (BlobInfo *)
               std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::end
                         (in_stack_fffffffffffffef8);
    local_80[0] = std::
                  max_element<__gnu_cxx::__normal_iterator<Blob_Detection::BlobInfo_const*,std::vector<Blob_Detection::BlobInfo,std::allocator<Blob_Detection::BlobInfo>>>,Blob_Detection::BlobDetection::getBestBlob(Blob_Detection::BlobDetection::BlobCriterion)const::__3>
                            (local_88,local_90);
    local_8 = __gnu_cxx::
              __normal_iterator<const_Blob_Detection::BlobInfo_*,_std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>_>
              ::operator*(local_80);
    break;
  case 4:
    local_a8 = (BlobInfo *)
               std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::
               begin(in_stack_fffffffffffffef8);
    local_b0 = (BlobInfo *)
               std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::end
                         (in_stack_fffffffffffffef8);
    local_a0[0] = std::
                  max_element<__gnu_cxx::__normal_iterator<Blob_Detection::BlobInfo_const*,std::vector<Blob_Detection::BlobInfo,std::allocator<Blob_Detection::BlobInfo>>>,Blob_Detection::BlobDetection::getBestBlob(Blob_Detection::BlobDetection::BlobCriterion)const::__4>
                            (local_a8,local_b0);
    local_8 = __gnu_cxx::
              __normal_iterator<const_Blob_Detection::BlobInfo_*,_std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>_>
              ::operator*(local_a0);
    break;
  case 5:
    cVar1 = std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::begin
                      (in_stack_fffffffffffffef8);
    cVar2 = std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::end
                      (in_stack_fffffffffffffef8);
    local_c0[0] = std::
                  max_element<__gnu_cxx::__normal_iterator<Blob_Detection::BlobInfo_const*,std::vector<Blob_Detection::BlobInfo,std::allocator<Blob_Detection::BlobInfo>>>,Blob_Detection::BlobDetection::getBestBlob(Blob_Detection::BlobDetection::BlobCriterion)const::__5>
                            (cVar1._M_current,cVar2._M_current);
    local_8 = __gnu_cxx::
              __normal_iterator<const_Blob_Detection::BlobInfo_*,_std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>_>
              ::operator*(local_c0);
    break;
  default:
    uVar3 = __cxa_allocate_exception(0x28);
    imageException::imageException(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    __cxa_throw(uVar3,&imageException::typeinfo,imageException::~imageException);
  }
  return local_8;
}

Assistant:

const BlobInfo & BlobDetection::getBestBlob( BlobCriterion criterion ) const
    {
        switch( criterion ) {
            case CRITERION_CIRCULARITY:
                return *(std::max_element( _blob.begin(), _blob.end(), []( const BlobInfo & blob1, const BlobInfo & blob2 )
                    { return blob1.circularity() < blob2.circularity(); } ));
            case CRITERION_ELONGATION:
                return *(std::max_element( _blob.begin(), _blob.end(), []( const BlobInfo & blob1, const BlobInfo & blob2 )
                    { return blob1.elongation() < blob2.elongation(); } ));
            case CRITERION_HEIGHT:
                return *(std::max_element( _blob.begin(), _blob.end(), []( const BlobInfo & blob1, const BlobInfo & blob2 )
                    { return blob1.height() < blob2.height(); } ));
            case CRITERION_LENGTH:
                return *(std::max_element( _blob.begin(), _blob.end(), []( const BlobInfo & blob1, const BlobInfo & blob2 )
                    { return blob1.length() < blob2.length(); } ));
            case CRITERION_SIZE:
                return *(std::max_element( _blob.begin(), _blob.end(), []( const BlobInfo & blob1, const BlobInfo & blob2 )
                    { return blob1.size() < blob2.size(); } ));
            case CRITERION_WIDTH:
                return *(std::max_element( _blob.begin(), _blob.end(), []( const BlobInfo & blob1, const BlobInfo & blob2 )
                    { return blob1.width() < blob2.width(); } ));
            default:
                throw imageException( "Bad criterion for blob finding" );
        }
    }